

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_logisim.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_18860d::LogisimParser::add_pin_location
          (LogisimParser *this,Position *loc,pin_id_t start,size_t count)

{
  bool bVar1;
  mapped_type *this_00;
  _Node_iterator_base<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>
  local_78;
  _Node_iterator_base<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>,_false>
  local_70;
  iterator res;
  value_type_conflict1 local_58;
  pointer local_50;
  size_t i;
  LogisimConnection connection;
  size_t count_local;
  pin_id_t start_local;
  Position *loc_local;
  LogisimParser *this_local;
  
  connection.m_pins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)count;
  LogisimConnection::LogisimConnection((LogisimConnection *)&i);
  i = loc->m_full;
  for (local_50 = (pointer)0x0;
      local_50 <
      connection.m_pins.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage; local_50 = (pointer)((long)local_50 + 1)) {
    local_58 = start + (long)local_50;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&connection,&local_58);
  }
  local_70._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
       ::find(&(this->m_context).m_pin_locs,&loc->m_full);
  local_78._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
       ::end(&(this->m_context).m_pin_locs);
  bVar1 = std::__detail::operator!=(&local_70,&local_78);
  if (!bVar1) {
    this_00 = std::
              unordered_map<unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_(anonymous_namespace)::LogisimParser::LogisimConnection>_>_>
              ::operator[](&(this->m_context).m_pin_locs,&loc->m_full);
    LogisimConnection::operator=(this_00,(LogisimConnection *)&i);
  }
  LogisimConnection::~LogisimConnection((LogisimConnection *)&i);
  return;
}

Assistant:

void LogisimParser::add_pin_location(const Position &loc, pin_id_t start, size_t count) {
    LogisimConnection connection;
    connection.m_position = loc;

    for (size_t i = 0; i < count; ++i) {
       connection.m_pins.push_back(start + i);
    }

    // connect if there is already a pin in the same location
    auto res = m_context.m_pin_locs.find(loc.m_full);
    if (res != m_context.m_pin_locs.end()) {
        // XXX make_connection(connection, res->second);
    } else {
       m_context.m_pin_locs[loc.m_full] = connection;
    }
}